

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_load_image_from_file_data_to_buffer
          (rf_image *__return_storage_ptr__,void *src,rf_int src_size,void *dst,rf_int dst_size,
          rf_desired_channels channels,rf_allocator temp_allocator)

{
  long lVar1;
  rf_source_location source_location;
  rf_source_location rVar2;
  rf_source_location source_location_00;
  rf_allocator_args rVar3;
  int iVar4;
  stbi_uc *__src;
  long *in_FS_OFFSET;
  undefined4 uStack_11c;
  uint uStack_ec;
  undefined4 uStack_b4;
  int output_buffer_size;
  void *output_buffer;
  uint local_70;
  int img_bpp;
  int img_height;
  int img_width;
  char *local_60;
  undefined8 local_58;
  undefined4 local_50;
  undefined4 uStack_4c;
  char *local_48;
  char *local_40;
  undefined8 local_38;
  rf_desired_channels local_2c;
  rf_int rStack_28;
  rf_desired_channels channels_local;
  rf_int dst_size_local;
  void *dst_local;
  rf_int src_size_local;
  void *src_local;
  
  local_2c = channels;
  rStack_28 = dst_size;
  dst_size_local = (rf_int)dst;
  dst_local = (void *)src_size;
  src_size_local = (rf_int)src;
  if ((src == (void *)0x0) || (src_size < 1)) {
    local_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    local_40 = "rf_load_image_from_file_data_to_buffer";
    local_38 = 0x3c4b;
    rf_log_impl(8,0x1b2691,(char *)0x1);
    lVar1 = *in_FS_OFFSET;
    _img_height = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    local_60 = "rf_load_image_from_file_data_to_buffer";
    local_58 = 0x3c4b;
    local_50 = 1;
    *(char **)(lVar1 + -0x460) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(lVar1 + -0x458) = "rf_load_image_from_file_data_to_buffer";
    *(undefined8 *)(lVar1 + -0x450) = 0x3c4b;
    *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_4c,1);
    memset(__return_storage_ptr__,0,0x18);
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    img_bpp = 0;
    local_70 = 0;
    output_buffer._4_4_ = 0;
    lVar1 = *in_FS_OFFSET;
    *(void **)(lVar1 + -0x440) = temp_allocator.user_data;
    *(rf_allocator_proc **)(lVar1 + -0x438) = temp_allocator.allocator_proc;
    __src = stbi_load_from_memory
                      ((stbi_uc *)src_size_local,(int)dst_local,&img_bpp,(int *)&local_70,
                       (int *)((long)&output_buffer + 4),local_2c);
    lVar1 = *in_FS_OFFSET;
    *(undefined8 *)(lVar1 + -0x440) = 0;
    *(undefined8 *)(lVar1 + -0x438) = 0;
    if (__src == (stbi_uc *)0x0) {
      source_location_00.proc_name = "rf_load_image_from_file_data_to_buffer";
      source_location_00.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      source_location_00.line_in_file = 0x3c71;
      rf_log_impl(source_location_00,RF_LOG_TYPE_ERROR,
                  "File format not supported or could not be loaded. STB Image returned { x: %d, y: %d, channels: %d }"
                  ,7,(ulong)(uint)img_bpp,(ulong)local_70,(ulong)output_buffer._4_4_);
      lVar1 = *in_FS_OFFSET;
      *(char **)(lVar1 + -0x460) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(lVar1 + -0x458) = "rf_load_image_from_file_data_to_buffer";
      *(undefined8 *)(lVar1 + -0x450) = 0x3c71;
      *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_11c,7);
    }
    else {
      iVar4 = img_bpp * local_70 * output_buffer._4_4_;
      if (rStack_28 < iVar4) {
        source_location.proc_name = "rf_load_image_from_file_data_to_buffer";
        source_location.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        source_location.line_in_file = 0x3c6d;
        rf_log_impl(source_location,RF_LOG_TYPE_ERROR,"Buffer is not big enough",1,
                    (ulong)(uint)img_bpp,(ulong)local_70,(ulong)output_buffer._4_4_);
        lVar1 = *in_FS_OFFSET;
        *(char **)(lVar1 + -0x460) =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        *(char **)(lVar1 + -0x458) = "rf_load_image_from_file_data_to_buffer";
        *(undefined8 *)(lVar1 + -0x450) = 0x3c6d;
        *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_b4,1);
      }
      else {
        __return_storage_ptr__->data = (void *)dst_size_local;
        __return_storage_ptr__->width = img_bpp;
        __return_storage_ptr__->height = local_70;
        __return_storage_ptr__->valid = true;
        switch(output_buffer._4_4_) {
        case 1:
          __return_storage_ptr__->format = RF_UNCOMPRESSED_GRAYSCALE;
          break;
        case 2:
          __return_storage_ptr__->format = RF_UNCOMPRESSED_GRAY_ALPHA;
          break;
        case 3:
          __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8;
          break;
        case 4:
          __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
        }
        memcpy((void *)dst_size_local,__src,(long)iVar4);
      }
      rVar2.proc_name = "rf_load_image_from_file_data_to_buffer";
      rVar2.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar2.line_in_file = 0x3c6f;
      rVar3.size_to_allocate_or_reallocate = 0;
      rVar3.pointer_to_free_or_realloc = __src;
      rVar3._16_8_ = (ulong)uStack_ec << 0x20;
      (*temp_allocator.allocator_proc)(&temp_allocator,rVar2,RF_AM_FREE,rVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_load_image_from_file_data_to_buffer(const void* src, rf_int src_size, void* dst, rf_int dst_size, rf_desired_channels channels, rf_allocator temp_allocator)
{
    if (src == NULL || src_size <= 0) { RF_LOG_ERROR(RF_BAD_ARGUMENT, "Argument `image` was invalid."); return (rf_image){0}; }

    rf_image result = {0};

    int img_width  = 0;
    int img_height = 0;
    int img_bpp    = 0;

    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator);
    void* output_buffer = stbi_load_from_memory(src, src_size, &img_width, &img_height, &img_bpp, channels);
    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

    if (output_buffer)
    {
        int output_buffer_size = img_width * img_height * img_bpp;

        if (dst_size >= output_buffer_size)
        {
            result.data   = dst;
            result.width  = img_width;
            result.height = img_height;
            result.valid  = true;

            switch (img_bpp)
            {
                case 1: result.format = RF_UNCOMPRESSED_GRAYSCALE; break;
                case 2: result.format = RF_UNCOMPRESSED_GRAY_ALPHA; break;
                case 3: result.format = RF_UNCOMPRESSED_R8G8B8; break;
                case 4: result.format = RF_UNCOMPRESSED_R8G8B8A8; break;
                default: break;
            }

            memcpy(dst, output_buffer, output_buffer_size);
        }
        else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Buffer is not big enough", img_width, img_height, img_bpp);

        RF_FREE(temp_allocator, output_buffer);
    }
    else RF_LOG_ERROR(RF_STBI_FAILED, "File format not supported or could not be loaded. STB Image returned { x: %d, y: %d, channels: %d }", img_width, img_height, img_bpp);

    return result;
}